

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::V1LayerParameter::MergeFrom(V1LayerParameter *this,V1LayerParameter *from)

{
  byte *pbVar1;
  uint32 *puVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  string *initial_value;
  string *psVar6;
  LogMessage *pLVar7;
  V0LayerParameter *pVVar8;
  ConcatParameter *pCVar9;
  ConvolutionParameter *pCVar10;
  DataParameter *pDVar11;
  DropoutParameter *pDVar12;
  HDF5DataParameter *pHVar13;
  HDF5OutputParameter *pHVar14;
  ImageDataParameter *pIVar15;
  InfogainLossParameter *pIVar16;
  InnerProductParameter *pIVar17;
  LRNParameter *pLVar18;
  PoolingParameter *pPVar19;
  WindowDataParameter *pWVar20;
  PowerParameter *pPVar21;
  MemoryDataParameter *pMVar22;
  ArgMaxParameter *pAVar23;
  EltwiseParameter *pEVar24;
  ThresholdParameter *pTVar25;
  DummyDataParameter *pDVar26;
  AccuracyParameter *pAVar27;
  HingeLossParameter *pHVar28;
  ReLUParameter *pRVar29;
  SliceParameter *pSVar30;
  MVNParameter *pMVar31;
  TransformationParameter *pTVar32;
  TanHParameter *pTVar33;
  SigmoidParameter *pSVar34;
  SoftmaxParameter *pSVar35;
  ContrastiveLossParameter *pCVar36;
  ExpParameter *pEVar37;
  LossParameter *pLVar38;
  LogFinisher local_139;
  LogMessage local_138;
  LogMessage local_100;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_100,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0xa60c);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       (&local_100,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage(&local_100);
  }
  pvVar5 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->bottom_).super_RepeatedPtrFieldBase,&(from->bottom_).super_RepeatedPtrFieldBase
            );
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->top_).super_RepeatedPtrFieldBase,&(from->top_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
            (&(this->blobs_).super_RepeatedPtrFieldBase,&(from->blobs_).super_RepeatedPtrFieldBase);
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c8,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
  }
  iVar3 = (from->blobs_lr_).current_size_;
  if (iVar3 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->blobs_lr_,iVar3 + (this->blobs_lr_).current_size_);
    memcpy(((this->blobs_lr_).rep_)->elements + (this->blobs_lr_).current_size_,
           ((from->blobs_lr_).rep_)->elements,(long)(from->blobs_lr_).current_size_ << 2);
    (this->blobs_lr_).current_size_ =
         (this->blobs_lr_).current_size_ + (from->blobs_lr_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       (&local_90,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  iVar3 = (from->weight_decay_).current_size_;
  if (iVar3 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->weight_decay_,iVar3 + (this->weight_decay_).current_size_);
    memcpy(((this->weight_decay_).rep_)->elements + (this->weight_decay_).current_size_,
           ((from->weight_decay_).rep_)->elements,(long)(from->weight_decay_).current_size_ << 2);
    (this->weight_decay_).current_size_ =
         (this->weight_decay_).current_size_ + (from->weight_decay_).current_size_;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->include_).super_RepeatedPtrFieldBase,
             &(from->include_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->exclude_).super_RepeatedPtrFieldBase,
             &(from->exclude_).super_RepeatedPtrFieldBase);
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  iVar3 = (from->loss_weight_).current_size_;
  if (iVar3 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->loss_weight_,iVar3 + (this->loss_weight_).current_size_);
    memcpy(((this->loss_weight_).rep_)->elements + (this->loss_weight_).current_size_,
           ((from->loss_weight_).rep_)->elements,(long)(from->loss_weight_).current_size_ << 2);
    (this->loss_weight_).current_size_ =
         (this->loss_weight_).current_size_ + (from->loss_weight_).current_size_;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->param_).super_RepeatedPtrFieldBase,&(from->param_).super_RepeatedPtrFieldBase);
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_138,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar7 = google::protobuf::internal::LogMessage::operator<<
                       (&local_138,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_139,pLVar7);
    google::protobuf::internal::LogMessage::~LogMessage(&local_138);
  }
  iVar3 = (from->blob_share_mode_).current_size_;
  if (iVar3 != 0) {
    google::protobuf::RepeatedField<int>::Reserve
              (&this->blob_share_mode_,iVar3 + (this->blob_share_mode_).current_size_);
    memcpy(((this->blob_share_mode_).rep_)->elements + (this->blob_share_mode_).current_size_,
           ((from->blob_share_mode_).rep_)->elements,
           (long)(from->blob_share_mode_).current_size_ << 2);
    (this->blob_share_mode_).current_size_ =
         (this->blob_share_mode_).current_size_ + (from->blob_share_mode_).current_size_;
  }
  uVar4 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar4 != '\0') {
    if ((uVar4 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      initial_value = (from->name_).ptr_;
      psVar6 = (this->name_).ptr_;
      if (psVar6 != initial_value) {
        if (psVar6 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (&this->name_,initial_value);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar6);
        }
      }
    }
    if ((uVar4 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if (this->layer_ == (V0LayerParameter *)0x0) {
        pVVar8 = (V0LayerParameter *)operator_new(0x100);
        V0LayerParameter::V0LayerParameter(pVVar8);
        this->layer_ = pVVar8;
      }
      pVVar8 = from->layer_;
      if (pVVar8 == (V0LayerParameter *)0x0) {
        pVVar8 = (V0LayerParameter *)&_V0LayerParameter_default_instance_;
      }
      V0LayerParameter::MergeFrom(this->layer_,pVVar8);
    }
    if ((uVar4 & 4) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      if (this->concat_param_ == (ConcatParameter *)0x0) {
        pCVar9 = (ConcatParameter *)operator_new(0x20);
        ConcatParameter::ConcatParameter(pCVar9);
        this->concat_param_ = pCVar9;
      }
      pCVar9 = from->concat_param_;
      if (pCVar9 == (ConcatParameter *)0x0) {
        pCVar9 = (ConcatParameter *)&_ConcatParameter_default_instance_;
      }
      ConcatParameter::MergeFrom(this->concat_param_,pCVar9);
    }
    if ((uVar4 & 8) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      if (this->convolution_param_ == (ConvolutionParameter *)0x0) {
        pCVar10 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar10);
        this->convolution_param_ = pCVar10;
      }
      pCVar10 = from->convolution_param_;
      if (pCVar10 == (ConvolutionParameter *)0x0) {
        pCVar10 = (ConvolutionParameter *)&_ConvolutionParameter_default_instance_;
      }
      ConvolutionParameter::MergeFrom(this->convolution_param_,pCVar10);
    }
    if ((uVar4 & 0x10) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      if (this->data_param_ == (DataParameter *)0x0) {
        pDVar11 = (DataParameter *)operator_new(0x48);
        DataParameter::DataParameter(pDVar11);
        this->data_param_ = pDVar11;
      }
      pDVar11 = from->data_param_;
      if (pDVar11 == (DataParameter *)0x0) {
        pDVar11 = (DataParameter *)&_DataParameter_default_instance_;
      }
      DataParameter::MergeFrom(this->data_param_,pDVar11);
    }
    if ((uVar4 & 0x20) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      if (this->dropout_param_ == (DropoutParameter *)0x0) {
        pDVar12 = (DropoutParameter *)operator_new(0x20);
        DropoutParameter::DropoutParameter(pDVar12);
        this->dropout_param_ = pDVar12;
      }
      pDVar12 = from->dropout_param_;
      if (pDVar12 == (DropoutParameter *)0x0) {
        pDVar12 = (DropoutParameter *)&_DropoutParameter_default_instance_;
      }
      DropoutParameter::MergeFrom(this->dropout_param_,pDVar12);
    }
    if ((uVar4 & 0x40) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
      if (this->hdf5_data_param_ == (HDF5DataParameter *)0x0) {
        pHVar13 = (HDF5DataParameter *)operator_new(0x28);
        HDF5DataParameter::HDF5DataParameter(pHVar13);
        this->hdf5_data_param_ = pHVar13;
      }
      pHVar13 = from->hdf5_data_param_;
      if (pHVar13 == (HDF5DataParameter *)0x0) {
        pHVar13 = (HDF5DataParameter *)&_HDF5DataParameter_default_instance_;
      }
      HDF5DataParameter::MergeFrom(this->hdf5_data_param_,pHVar13);
    }
    if ((char)uVar4 < '\0') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
      if (this->hdf5_output_param_ == (HDF5OutputParameter *)0x0) {
        pHVar14 = (HDF5OutputParameter *)operator_new(0x20);
        HDF5OutputParameter::HDF5OutputParameter(pHVar14);
        this->hdf5_output_param_ = pHVar14;
      }
      pHVar14 = from->hdf5_output_param_;
      if (pHVar14 == (HDF5OutputParameter *)0x0) {
        pHVar14 = (HDF5OutputParameter *)&_HDF5OutputParameter_default_instance_;
      }
      HDF5OutputParameter::MergeFrom(this->hdf5_output_param_,pHVar14);
    }
  }
  if ((uVar4 & 0xff00) != 0) {
    if ((uVar4 >> 8 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 1;
      if (this->image_data_param_ == (ImageDataParameter *)0x0) {
        pIVar15 = (ImageDataParameter *)operator_new(0x50);
        ImageDataParameter::ImageDataParameter(pIVar15);
        this->image_data_param_ = pIVar15;
      }
      pIVar15 = from->image_data_param_;
      if (pIVar15 == (ImageDataParameter *)0x0) {
        pIVar15 = (ImageDataParameter *)&_ImageDataParameter_default_instance_;
      }
      ImageDataParameter::MergeFrom(this->image_data_param_,pIVar15);
    }
    if ((uVar4 >> 9 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 2;
      if (this->infogain_loss_param_ == (InfogainLossParameter *)0x0) {
        pIVar16 = (InfogainLossParameter *)operator_new(0x20);
        InfogainLossParameter::InfogainLossParameter(pIVar16);
        this->infogain_loss_param_ = pIVar16;
      }
      pIVar16 = from->infogain_loss_param_;
      if (pIVar16 == (InfogainLossParameter *)0x0) {
        pIVar16 = (InfogainLossParameter *)&_InfogainLossParameter_default_instance_;
      }
      InfogainLossParameter::MergeFrom(this->infogain_loss_param_,pIVar16);
    }
    if ((uVar4 >> 10 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 4;
      if (this->inner_product_param_ == (InnerProductParameter *)0x0) {
        pIVar17 = (InnerProductParameter *)operator_new(0x38);
        InnerProductParameter::InnerProductParameter(pIVar17);
        this->inner_product_param_ = pIVar17;
      }
      pIVar17 = from->inner_product_param_;
      if (pIVar17 == (InnerProductParameter *)0x0) {
        pIVar17 = (InnerProductParameter *)&_InnerProductParameter_default_instance_;
      }
      InnerProductParameter::MergeFrom(this->inner_product_param_,pIVar17);
    }
    if ((uVar4 >> 0xb & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 8;
      if (this->lrn_param_ == (LRNParameter *)0x0) {
        pLVar18 = (LRNParameter *)operator_new(0x30);
        LRNParameter::LRNParameter(pLVar18);
        this->lrn_param_ = pLVar18;
      }
      pLVar18 = from->lrn_param_;
      if (pLVar18 == (LRNParameter *)0x0) {
        pLVar18 = (LRNParameter *)&_LRNParameter_default_instance_;
      }
      LRNParameter::MergeFrom(this->lrn_param_,pLVar18);
    }
    if ((uVar4 >> 0xc & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 0x10;
      if (this->pooling_param_ == (PoolingParameter *)0x0) {
        pPVar19 = (PoolingParameter *)operator_new(0x48);
        PoolingParameter::PoolingParameter(pPVar19);
        this->pooling_param_ = pPVar19;
      }
      pPVar19 = from->pooling_param_;
      if (pPVar19 == (PoolingParameter *)0x0) {
        pPVar19 = (PoolingParameter *)&_PoolingParameter_default_instance_;
      }
      PoolingParameter::MergeFrom(this->pooling_param_,pPVar19);
    }
    if ((uVar4 >> 0xd & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 0x20;
      if (this->window_data_param_ == (WindowDataParameter *)0x0) {
        pWVar20 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(pWVar20);
        this->window_data_param_ = pWVar20;
      }
      pWVar20 = from->window_data_param_;
      if (pWVar20 == (WindowDataParameter *)0x0) {
        pWVar20 = (WindowDataParameter *)&_WindowDataParameter_default_instance_;
      }
      WindowDataParameter::MergeFrom(this->window_data_param_,pWVar20);
    }
    if ((uVar4 >> 0xe & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 0x40;
      if (this->power_param_ == (PowerParameter *)0x0) {
        pPVar21 = (PowerParameter *)operator_new(0x28);
        PowerParameter::PowerParameter(pPVar21);
        this->power_param_ = pPVar21;
      }
      pPVar21 = from->power_param_;
      if (pPVar21 == (PowerParameter *)0x0) {
        pPVar21 = (PowerParameter *)&_PowerParameter_default_instance_;
      }
      PowerParameter::MergeFrom(this->power_param_,pPVar21);
    }
    if ((short)uVar4 < 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 0x80;
      if (this->memory_data_param_ == (MemoryDataParameter *)0x0) {
        pMVar22 = (MemoryDataParameter *)operator_new(0x28);
        MemoryDataParameter::MemoryDataParameter(pMVar22);
        this->memory_data_param_ = pMVar22;
      }
      pMVar22 = from->memory_data_param_;
      if (pMVar22 == (MemoryDataParameter *)0x0) {
        pMVar22 = (MemoryDataParameter *)&_MemoryDataParameter_default_instance_;
      }
      MemoryDataParameter::MergeFrom(this->memory_data_param_,pMVar22);
    }
  }
  if ((uVar4 & 0xff0000) != 0) {
    if ((uVar4 >> 0x10 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 1;
      if (this->argmax_param_ == (ArgMaxParameter *)0x0) {
        pAVar23 = (ArgMaxParameter *)operator_new(0x28);
        ArgMaxParameter::ArgMaxParameter(pAVar23);
        this->argmax_param_ = pAVar23;
      }
      pAVar23 = from->argmax_param_;
      if (pAVar23 == (ArgMaxParameter *)0x0) {
        pAVar23 = (ArgMaxParameter *)&_ArgMaxParameter_default_instance_;
      }
      ArgMaxParameter::MergeFrom(this->argmax_param_,pAVar23);
    }
    if ((uVar4 >> 0x11 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 2;
      if (this->eltwise_param_ == (EltwiseParameter *)0x0) {
        pEVar24 = (EltwiseParameter *)operator_new(0x30);
        EltwiseParameter::EltwiseParameter(pEVar24);
        this->eltwise_param_ = pEVar24;
      }
      pEVar24 = from->eltwise_param_;
      if (pEVar24 == (EltwiseParameter *)0x0) {
        pEVar24 = (EltwiseParameter *)&_EltwiseParameter_default_instance_;
      }
      EltwiseParameter::MergeFrom(this->eltwise_param_,pEVar24);
    }
    if ((uVar4 >> 0x12 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 4;
      if (this->threshold_param_ == (ThresholdParameter *)0x0) {
        pTVar25 = (ThresholdParameter *)operator_new(0x20);
        ThresholdParameter::ThresholdParameter(pTVar25);
        this->threshold_param_ = pTVar25;
      }
      pTVar25 = from->threshold_param_;
      if (pTVar25 == (ThresholdParameter *)0x0) {
        pTVar25 = (ThresholdParameter *)&_ThresholdParameter_default_instance_;
      }
      ThresholdParameter::MergeFrom(this->threshold_param_,pTVar25);
    }
    if ((uVar4 >> 0x13 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 8;
      if (this->dummy_data_param_ == (DummyDataParameter *)0x0) {
        pDVar26 = (DummyDataParameter *)operator_new(0x88);
        DummyDataParameter::DummyDataParameter(pDVar26);
        this->dummy_data_param_ = pDVar26;
      }
      pDVar26 = from->dummy_data_param_;
      if (pDVar26 == (DummyDataParameter *)0x0) {
        pDVar26 = (DummyDataParameter *)&_DummyDataParameter_default_instance_;
      }
      DummyDataParameter::MergeFrom(this->dummy_data_param_,pDVar26);
    }
    if ((uVar4 >> 0x14 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 0x10;
      if (this->accuracy_param_ == (AccuracyParameter *)0x0) {
        pAVar27 = (AccuracyParameter *)operator_new(0x28);
        AccuracyParameter::AccuracyParameter(pAVar27);
        this->accuracy_param_ = pAVar27;
      }
      pAVar27 = from->accuracy_param_;
      if (pAVar27 == (AccuracyParameter *)0x0) {
        pAVar27 = (AccuracyParameter *)&_AccuracyParameter_default_instance_;
      }
      AccuracyParameter::MergeFrom(this->accuracy_param_,pAVar27);
    }
    if ((uVar4 >> 0x15 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 0x20;
      if (this->hinge_loss_param_ == (HingeLossParameter *)0x0) {
        pHVar28 = (HingeLossParameter *)operator_new(0x20);
        HingeLossParameter::HingeLossParameter(pHVar28);
        this->hinge_loss_param_ = pHVar28;
      }
      pHVar28 = from->hinge_loss_param_;
      if (pHVar28 == (HingeLossParameter *)0x0) {
        pHVar28 = (HingeLossParameter *)&_HingeLossParameter_default_instance_;
      }
      HingeLossParameter::MergeFrom(this->hinge_loss_param_,pHVar28);
    }
    if ((uVar4 >> 0x16 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 0x40;
      if (this->relu_param_ == (ReLUParameter *)0x0) {
        pRVar29 = (ReLUParameter *)operator_new(0x20);
        ReLUParameter::ReLUParameter(pRVar29);
        this->relu_param_ = pRVar29;
      }
      pRVar29 = from->relu_param_;
      if (pRVar29 == (ReLUParameter *)0x0) {
        pRVar29 = (ReLUParameter *)&_ReLUParameter_default_instance_;
      }
      ReLUParameter::MergeFrom(this->relu_param_,pRVar29);
    }
    if ((uVar4 >> 0x17 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 0x80;
      if (this->slice_param_ == (SliceParameter *)0x0) {
        pSVar30 = (SliceParameter *)operator_new(0x30);
        SliceParameter::SliceParameter(pSVar30);
        this->slice_param_ = pSVar30;
      }
      pSVar30 = from->slice_param_;
      if (pSVar30 == (SliceParameter *)0x0) {
        pSVar30 = (SliceParameter *)&_SliceParameter_default_instance_;
      }
      SliceParameter::MergeFrom(this->slice_param_,pSVar30);
    }
  }
  if (0xffffff < uVar4) {
    if ((uVar4 >> 0x18 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 1;
      if (this->mvn_param_ == (MVNParameter *)0x0) {
        pMVar31 = (MVNParameter *)operator_new(0x20);
        MVNParameter::MVNParameter(pMVar31);
        this->mvn_param_ = pMVar31;
      }
      pMVar31 = from->mvn_param_;
      if (pMVar31 == (MVNParameter *)0x0) {
        pMVar31 = (MVNParameter *)&_MVNParameter_default_instance_;
      }
      MVNParameter::MergeFrom(this->mvn_param_,pMVar31);
    }
    if ((uVar4 >> 0x19 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 2;
      if (this->transform_param_ == (TransformationParameter *)0x0) {
        pTVar32 = (TransformationParameter *)operator_new(0x40);
        TransformationParameter::TransformationParameter(pTVar32);
        this->transform_param_ = pTVar32;
      }
      pTVar32 = from->transform_param_;
      if (pTVar32 == (TransformationParameter *)0x0) {
        pTVar32 = (TransformationParameter *)&_TransformationParameter_default_instance_;
      }
      TransformationParameter::MergeFrom(this->transform_param_,pTVar32);
    }
    if ((uVar4 >> 0x1a & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 4;
      if (this->tanh_param_ == (TanHParameter *)0x0) {
        pTVar33 = (TanHParameter *)operator_new(0x20);
        TanHParameter::TanHParameter(pTVar33);
        this->tanh_param_ = pTVar33;
      }
      pTVar33 = from->tanh_param_;
      if (pTVar33 == (TanHParameter *)0x0) {
        pTVar33 = (TanHParameter *)&_TanHParameter_default_instance_;
      }
      TanHParameter::MergeFrom(this->tanh_param_,pTVar33);
    }
    if ((uVar4 >> 0x1b & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 8;
      if (this->sigmoid_param_ == (SigmoidParameter *)0x0) {
        pSVar34 = (SigmoidParameter *)operator_new(0x20);
        SigmoidParameter::SigmoidParameter(pSVar34);
        this->sigmoid_param_ = pSVar34;
      }
      pSVar34 = from->sigmoid_param_;
      if (pSVar34 == (SigmoidParameter *)0x0) {
        pSVar34 = (SigmoidParameter *)&_SigmoidParameter_default_instance_;
      }
      SigmoidParameter::MergeFrom(this->sigmoid_param_,pSVar34);
    }
    if ((uVar4 >> 0x1c & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 0x10;
      if (this->softmax_param_ == (SoftmaxParameter *)0x0) {
        pSVar35 = (SoftmaxParameter *)operator_new(0x20);
        SoftmaxParameter::SoftmaxParameter(pSVar35);
        this->softmax_param_ = pSVar35;
      }
      pSVar35 = from->softmax_param_;
      if (pSVar35 == (SoftmaxParameter *)0x0) {
        pSVar35 = (SoftmaxParameter *)&_SoftmaxParameter_default_instance_;
      }
      SoftmaxParameter::MergeFrom(this->softmax_param_,pSVar35);
    }
    if ((uVar4 >> 0x1d & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 0x20;
      if (this->contrastive_loss_param_ == (ContrastiveLossParameter *)0x0) {
        pCVar36 = (ContrastiveLossParameter *)operator_new(0x20);
        ContrastiveLossParameter::ContrastiveLossParameter(pCVar36);
        this->contrastive_loss_param_ = pCVar36;
      }
      pCVar36 = from->contrastive_loss_param_;
      if (pCVar36 == (ContrastiveLossParameter *)0x0) {
        pCVar36 = (ContrastiveLossParameter *)&_ContrastiveLossParameter_default_instance_;
      }
      ContrastiveLossParameter::MergeFrom(this->contrastive_loss_param_,pCVar36);
    }
    if ((uVar4 >> 0x1e & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 0x40;
      if (this->exp_param_ == (ExpParameter *)0x0) {
        pEVar37 = (ExpParameter *)operator_new(0x28);
        ExpParameter::ExpParameter(pEVar37);
        this->exp_param_ = pEVar37;
      }
      pEVar37 = from->exp_param_;
      if (pEVar37 == (ExpParameter *)0x0) {
        pEVar37 = (ExpParameter *)&_ExpParameter_default_instance_;
      }
      ExpParameter::MergeFrom(this->exp_param_,pEVar37);
    }
    if ((int)uVar4 < 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 0x80;
      if (this->loss_param_ == (LossParameter *)0x0) {
        pLVar38 = (LossParameter *)operator_new(0x28);
        LossParameter::LossParameter(pLVar38);
        this->loss_param_ = pLVar38;
      }
      pLVar38 = from->loss_param_;
      if (pLVar38 == (LossParameter *)0x0) {
        pLVar38 = (LossParameter *)&_LossParameter_default_instance_;
      }
      LossParameter::MergeFrom(this->loss_param_,pLVar38);
    }
  }
  if (((from->_has_bits_).has_bits_[1] & 1) != 0) {
    uVar4 = from->type_;
    if (0x27 < uVar4) {
      __assert_fail("::caffe::V1LayerParameter_LayerType_IsValid(value)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/include/caffe/proto/caffe.pb.h"
                    ,0x5996,
                    "void caffe::V1LayerParameter::set_type(::caffe::V1LayerParameter_LayerType)");
    }
    puVar2 = (this->_has_bits_).has_bits_ + 1;
    *(byte *)puVar2 = (byte)*puVar2 | 1;
    this->type_ = uVar4;
  }
  return;
}

Assistant:

void V1LayerParameter::MergeFrom(const V1LayerParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.V1LayerParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  bottom_.MergeFrom(from.bottom_);
  top_.MergeFrom(from.top_);
  blobs_.MergeFrom(from.blobs_);
  blobs_lr_.MergeFrom(from.blobs_lr_);
  weight_decay_.MergeFrom(from.weight_decay_);
  include_.MergeFrom(from.include_);
  exclude_.MergeFrom(from.exclude_);
  loss_weight_.MergeFrom(from.loss_weight_);
  param_.MergeFrom(from.param_);
  blob_share_mode_.MergeFrom(from.blob_share_mode_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_layer()->::caffe::V0LayerParameter::MergeFrom(from.layer());
    }
    if (cached_has_bits & 0x00000004u) {
      mutable_concat_param()->::caffe::ConcatParameter::MergeFrom(from.concat_param());
    }
    if (cached_has_bits & 0x00000008u) {
      mutable_convolution_param()->::caffe::ConvolutionParameter::MergeFrom(from.convolution_param());
    }
    if (cached_has_bits & 0x00000010u) {
      mutable_data_param()->::caffe::DataParameter::MergeFrom(from.data_param());
    }
    if (cached_has_bits & 0x00000020u) {
      mutable_dropout_param()->::caffe::DropoutParameter::MergeFrom(from.dropout_param());
    }
    if (cached_has_bits & 0x00000040u) {
      mutable_hdf5_data_param()->::caffe::HDF5DataParameter::MergeFrom(from.hdf5_data_param());
    }
    if (cached_has_bits & 0x00000080u) {
      mutable_hdf5_output_param()->::caffe::HDF5OutputParameter::MergeFrom(from.hdf5_output_param());
    }
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      mutable_image_data_param()->::caffe::ImageDataParameter::MergeFrom(from.image_data_param());
    }
    if (cached_has_bits & 0x00000200u) {
      mutable_infogain_loss_param()->::caffe::InfogainLossParameter::MergeFrom(from.infogain_loss_param());
    }
    if (cached_has_bits & 0x00000400u) {
      mutable_inner_product_param()->::caffe::InnerProductParameter::MergeFrom(from.inner_product_param());
    }
    if (cached_has_bits & 0x00000800u) {
      mutable_lrn_param()->::caffe::LRNParameter::MergeFrom(from.lrn_param());
    }
    if (cached_has_bits & 0x00001000u) {
      mutable_pooling_param()->::caffe::PoolingParameter::MergeFrom(from.pooling_param());
    }
    if (cached_has_bits & 0x00002000u) {
      mutable_window_data_param()->::caffe::WindowDataParameter::MergeFrom(from.window_data_param());
    }
    if (cached_has_bits & 0x00004000u) {
      mutable_power_param()->::caffe::PowerParameter::MergeFrom(from.power_param());
    }
    if (cached_has_bits & 0x00008000u) {
      mutable_memory_data_param()->::caffe::MemoryDataParameter::MergeFrom(from.memory_data_param());
    }
  }
  if (cached_has_bits & 16711680u) {
    if (cached_has_bits & 0x00010000u) {
      mutable_argmax_param()->::caffe::ArgMaxParameter::MergeFrom(from.argmax_param());
    }
    if (cached_has_bits & 0x00020000u) {
      mutable_eltwise_param()->::caffe::EltwiseParameter::MergeFrom(from.eltwise_param());
    }
    if (cached_has_bits & 0x00040000u) {
      mutable_threshold_param()->::caffe::ThresholdParameter::MergeFrom(from.threshold_param());
    }
    if (cached_has_bits & 0x00080000u) {
      mutable_dummy_data_param()->::caffe::DummyDataParameter::MergeFrom(from.dummy_data_param());
    }
    if (cached_has_bits & 0x00100000u) {
      mutable_accuracy_param()->::caffe::AccuracyParameter::MergeFrom(from.accuracy_param());
    }
    if (cached_has_bits & 0x00200000u) {
      mutable_hinge_loss_param()->::caffe::HingeLossParameter::MergeFrom(from.hinge_loss_param());
    }
    if (cached_has_bits & 0x00400000u) {
      mutable_relu_param()->::caffe::ReLUParameter::MergeFrom(from.relu_param());
    }
    if (cached_has_bits & 0x00800000u) {
      mutable_slice_param()->::caffe::SliceParameter::MergeFrom(from.slice_param());
    }
  }
  if (cached_has_bits & 4278190080u) {
    if (cached_has_bits & 0x01000000u) {
      mutable_mvn_param()->::caffe::MVNParameter::MergeFrom(from.mvn_param());
    }
    if (cached_has_bits & 0x02000000u) {
      mutable_transform_param()->::caffe::TransformationParameter::MergeFrom(from.transform_param());
    }
    if (cached_has_bits & 0x04000000u) {
      mutable_tanh_param()->::caffe::TanHParameter::MergeFrom(from.tanh_param());
    }
    if (cached_has_bits & 0x08000000u) {
      mutable_sigmoid_param()->::caffe::SigmoidParameter::MergeFrom(from.sigmoid_param());
    }
    if (cached_has_bits & 0x10000000u) {
      mutable_softmax_param()->::caffe::SoftmaxParameter::MergeFrom(from.softmax_param());
    }
    if (cached_has_bits & 0x20000000u) {
      mutable_contrastive_loss_param()->::caffe::ContrastiveLossParameter::MergeFrom(from.contrastive_loss_param());
    }
    if (cached_has_bits & 0x40000000u) {
      mutable_exp_param()->::caffe::ExpParameter::MergeFrom(from.exp_param());
    }
    if (cached_has_bits & 0x80000000u) {
      mutable_loss_param()->::caffe::LossParameter::MergeFrom(from.loss_param());
    }
  }
  if (from.has_type()) {
    set_type(from.type());
  }
}